

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrawfont.cpp
# Opt level: O1

QImage * __thiscall
QRawFont::alphaMapForGlyph
          (QImage *__return_storage_ptr__,QRawFont *this,quint32 glyphIndex,
          AntialiasingType antialiasingType,QTransform *transform)

{
  long lVar1;
  QFontEngine *pQVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = ((this->d).d.ptr)->fontEngine;
  if (pQVar2 == (QFontEngine *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_004bd249;
    QImage::QImage(__return_storage_ptr__);
  }
  else {
    if (pQVar2->glyphFormat == Format_ARGB) {
      (*pQVar2->_vptr_QFontEngine[0x16])(__return_storage_ptr__);
    }
    else if (antialiasingType == SubPixelAntialiasing) {
      (*pQVar2->_vptr_QFontEngine[0x15])(__return_storage_ptr__);
    }
    else {
      (*pQVar2->_vptr_QFontEngine[0x14])(__return_storage_ptr__);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_004bd249:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QImage QRawFont::alphaMapForGlyph(quint32 glyphIndex, AntialiasingType antialiasingType,
                                  const QTransform &transform) const
{
    if (!d->isValid())
        return QImage();

    if (d->fontEngine->glyphFormat == QFontEngine::Format_ARGB)
        return d->fontEngine->bitmapForGlyph(glyphIndex, QFixedPoint(), transform);

    if (antialiasingType == SubPixelAntialiasing)
        return d->fontEngine->alphaRGBMapForGlyph(glyphIndex, QFixedPoint(), transform);

    return d->fontEngine->alphaMapForGlyph(glyphIndex, QFixedPoint(), transform);
}